

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O2

bool __thiscall
cmLoadCacheCommand::ReadWithPrefix
          (cmLoadCacheCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  string line;
  undefined1 *local_1280 [2];
  undefined1 local_1270 [16];
  string cacheFile;
  ifstream fin;
  long local_1238;
  byte abStack_1220 [488];
  char buffer [4096];
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x41) {
    std::__cxx11::string::string
              ((string *)buffer,"READ_WITH_PREFIX form must specify a prefix.",(allocator *)&fin);
    cmCommand::SetError(&this->super_cmCommand,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
    bVar1 = false;
  }
  else {
    std::operator+(&cacheFile,__lhs,"/CMakeCache.txt");
    bVar1 = cmsys::SystemTools::FileExists(cacheFile._M_dataplus._M_p);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&this->Prefix);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->VariablesToRead,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      std::ifstream::ifstream(&fin,cacheFile._M_dataplus._M_p,_S_in);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while ((abStack_1220[*(long *)(_fin + -0x18)] & 5) == 0) {
        std::istream::read((char *)&fin,(long)buffer);
        if (local_1238 != 0) {
          pcVar5 = buffer + local_1238;
          pcVar4 = buffer;
          while (pcVar2 = pcVar4, pcVar4 != pcVar5) {
            for (; (pcVar3 = pcVar5, pcVar2 != pcVar5 && (pcVar3 = pcVar2, *pcVar2 != '\n'));
                pcVar2 = pcVar2 + 1) {
            }
            local_1280[0] = local_1270;
            if ((pcVar3 == pcVar4) || (pcVar3[-1] != '\r')) {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1280,pcVar4,pcVar3);
              std::__cxx11::string::append((string *)&line);
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1280,pcVar4,pcVar3 + -1);
              std::__cxx11::string::append((string *)&line);
            }
            std::__cxx11::string::~string((string *)local_1280);
            pcVar4 = pcVar3;
            if (pcVar2 != pcVar5) {
              CheckLine(this,line._M_dataplus._M_p);
              std::__cxx11::string::assign((char *)&line);
              pcVar4 = pcVar3 + 1;
            }
          }
        }
      }
      if (line._M_string_length != 0) {
        CheckLine(this,line._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&fin);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     "Cannot load cache file from ",&cacheFile);
      cmCommand::SetError(&this->super_cmCommand,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
    }
    std::__cxx11::string::~string((string *)&cacheFile);
  }
  return bVar1;
}

Assistant:

bool cmLoadCacheCommand::ReadWithPrefix(std::vector<std::string> const& args)
{
  // Make sure we have a prefix.
  if(args.size() < 3)
    {
    this->SetError("READ_WITH_PREFIX form must specify a prefix.");
    return false;
    }

  // Make sure the cache file exists.
  std::string cacheFile = args[0]+"/CMakeCache.txt";
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    std::string e = "Cannot load cache file from " + cacheFile;
    this->SetError(e);
    return false;
    }

  // Prepare the table of variables to read.
  this->Prefix = args[2];
  this->VariablesToRead.insert(args.begin() + 3, args.end());

  // Read the cache file.
  cmsys::ifstream fin(cacheFile.c_str());

  // This is a big hack read loop to overcome a buggy ifstream
  // implementation on HP-UX.  This should work on all platforms even
  // for small buffer sizes.
  const int bufferSize = 4096;
  char buffer[bufferSize];
  std::string line;
  while(fin)
    {
    // Read a block of the file.
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      // Parse for newlines directly.
      const char* i = buffer;
      const char* end = buffer+fin.gcount();
      while(i != end)
        {
        const char* begin = i;
        while(i != end && *i != '\n') { ++i; }
        if(i == begin || *(i-1) != '\r')
          {
          // Include this portion of the line.
          line += std::string(begin, i-begin);
          }
        else
          {
          // Include this portion of the line.
          // Don't include the \r in a \r\n pair.
          line += std::string(begin, i-1-begin);
          }
        if(i != end)
          {
          // Completed a line.
          this->CheckLine(line.c_str());
          line = "";

          // Skip the newline character.
          ++i;
          }
        }
      }
    }
  if(!line.empty())
    {
    // Partial last line.
    this->CheckLine(line.c_str());
    }

  return true;
}